

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlUnlinkNodeInternal(xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode **pp_Var2;
  long lVar3;
  
  p_Var1 = cur->parent;
  if (p_Var1 == (_xmlNode *)0x0) goto LAB_0014bc7b;
  if (cur->type == XML_ATTRIBUTE_NODE) {
    if ((xmlNodePtr)p_Var1->properties == cur) {
      pp_Var2 = (_xmlNode **)&p_Var1->properties;
      lVar3 = 0x30;
LAB_0014bc6c:
      *pp_Var2 = *(_xmlNode **)((long)&cur->_private + lVar3);
    }
  }
  else {
    if (p_Var1->children == cur) {
      p_Var1->children = cur->next;
    }
    if (p_Var1->last == cur) {
      pp_Var2 = &p_Var1->last;
      lVar3 = 0x38;
      goto LAB_0014bc6c;
    }
  }
  cur->parent = (_xmlNode *)0x0;
LAB_0014bc7b:
  p_Var1 = cur->next;
  if (p_Var1 != (_xmlNode *)0x0) {
    p_Var1->prev = cur->prev;
  }
  if (cur->prev != (_xmlNode *)0x0) {
    cur->prev->next = p_Var1;
  }
  cur->next = (_xmlNode *)0x0;
  cur->prev = (_xmlNode *)0x0;
  return;
}

Assistant:

static void
xmlUnlinkNodeInternal(xmlNodePtr cur) {
    if (cur->parent != NULL) {
	xmlNodePtr parent;
	parent = cur->parent;
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (parent->properties == (xmlAttrPtr) cur)
		parent->properties = ((xmlAttrPtr) cur)->next;
	} else {
	    if (parent->children == cur)
		parent->children = cur->next;
	    if (parent->last == cur)
		parent->last = cur->prev;
	}
	cur->parent = NULL;
    }

    if (cur->next != NULL)
        cur->next->prev = cur->prev;
    if (cur->prev != NULL)
        cur->prev->next = cur->next;
    cur->next = NULL;
    cur->prev = NULL;
}